

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O0

void __thiscall IDisk::DumpTrack(IDisk *this,int side,uint track,int rev)

{
  byte bVar1;
  char cVar2;
  long lVar3;
  long extraout_RDX;
  long extraout_RDX_00;
  int local_30;
  uchar b;
  int j;
  uchar byte;
  int i;
  int shift;
  uint index;
  int rev_local;
  uint track_local;
  int side_local;
  IDisk *this_local;
  
  i = 0;
  cVar2 = '\0';
  while( true ) {
    lVar3 = (ulong)track * 0x20;
    if (this->side_[side].tracks[track].size <= (uint)i) break;
    for (j = 0; j < 2; j = j + 1) {
      b = '\0';
      for (local_30 = 0; local_30 < 8; local_30 = local_30 + 1) {
        if ((uint)(i + j * 8 + local_30) < this->side_[side].tracks[track].size) {
          bVar1 = this->side_[side].tracks[track].bitfield[(uint)(i + j * 8 + local_30 * 2)];
        }
        else {
          bVar1 = 0;
        }
        b = b << 1 | bVar1 & 1;
        lVar3 = (ulong)track * 0x20;
        if (this->side_[side].tracks[track].size <= (uint)(i + j * 8 + local_30)) {
          cVar2 = cVar2 + '\x01';
        }
      }
      if (this->log_ != (ILog *)0x0) {
        (**(code **)(*(long *)this->log_ + 8))(this->log_,b,lVar3,b);
        lVar3 = extraout_RDX;
      }
    }
    i = i + 0x10;
  }
  if (this->log_ != (ILog *)0x0) {
    (**(code **)(*(long *)this->log_ + 0x20))();
    lVar3 = extraout_RDX_00;
  }
  if (this->log_ != (ILog *)0x0) {
    (**(code **)(*(long *)this->log_ + 8))(this->log_,cVar2,lVar3,cVar2);
  }
  return;
}

Assistant:

void IDisk::DumpTrack(int side, unsigned int track, int rev)
{
   unsigned int index = 0;
   int shift = 0;
   while (index < side_[side].tracks[track].size)
   {
      for (int i = 0; i < 2; i++)
      {
         unsigned char byte = 0;
         for (int j = 0; j < 8; j++)
         {
            byte <<= 1;
            unsigned char b = (index + i * 8 + j < side_[side].tracks[track].size)
                                 ? side_[side].tracks[track].bitfield[index + i * 8 + (j * 2)]
                                 : 0;
            byte |= b & 0x1;

            if (index + i * 8 + j >= side_[side].tracks[track]./*Revolution[rev].*/size)
               shift++;
         }
         LOGB(byte)
      }
      index += 16;
   }
   LOGEOL
   LOGB(shift)
}